

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O0

void __thiscall spvtools::opt::MergeReturnPass::CreateReturnBlock(MergeReturnPass *this)

{
  uint32_t res_id;
  Instruction *pIVar1;
  IRContext *pIVar2;
  BasicBlock *this_00;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> *this_01;
  reference pvVar3;
  Function *pFVar4;
  iterator local_58;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> local_48;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_40;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> local_38;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
  return_block;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_18;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  return_label;
  MergeReturnPass *this_local;
  
  return_label._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
        )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )this;
  pIVar1 = (Instruction *)operator_new(0x70);
  pIVar2 = Pass::context((Pass *)this);
  res_id = Pass::TakeNextId((Pass *)this);
  memset(&return_block,0,0x18);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
             &return_block);
  Instruction::Instruction(pIVar1,pIVar2,OpLabel,0,res_id,(OperandList *)&return_block);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_18,pIVar1);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
             &return_block);
  this_00 = (BasicBlock *)operator_new(0x88);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  unique_ptr(&local_40,&local_18);
  BasicBlock::BasicBlock(this_00,&local_40);
  std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>::
  unique_ptr<std::default_delete<spvtools::opt::BasicBlock>,void>
            ((unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>> *
             )&local_38,this_00);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_40);
  pFVar4 = this->function_;
  std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
  unique_ptr(&local_48,&local_38);
  Function::AddBasicBlock(pFVar4,&local_48);
  std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
  ~unique_ptr(&local_48);
  local_58 = Function::end(this->function_);
  this_01 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator--(&local_58);
  pvVar3 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*(this_01);
  this->final_return_block_ = pvVar3;
  pIVar2 = Pass::context((Pass *)this);
  pIVar1 = BasicBlock::GetLabelInst(this->final_return_block_);
  IRContext::AnalyzeDefUse(pIVar2,pIVar1);
  pIVar2 = Pass::context((Pass *)this);
  pIVar1 = BasicBlock::GetLabelInst(this->final_return_block_);
  IRContext::set_instr_block(pIVar2,pIVar1,this->final_return_block_);
  pFVar4 = BasicBlock::GetParent(this->final_return_block_);
  if (pFVar4 != this->function_) {
    __assert_fail("final_return_block_->GetParent() == function_ && \"The function should have been set when the block was created.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp"
                  ,0xbc,"void spvtools::opt::MergeReturnPass::CreateReturnBlock()");
  }
  std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
  ~unique_ptr(&local_38);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_18);
  return;
}

Assistant:

void MergeReturnPass::CreateReturnBlock() {
  // Create a label for the new return block
  std::unique_ptr<Instruction> return_label(
      new Instruction(context(), spv::Op::OpLabel, 0u, TakeNextId(), {}));

  // Create the new basic block
  std::unique_ptr<BasicBlock> return_block(
      new BasicBlock(std::move(return_label)));
  function_->AddBasicBlock(std::move(return_block));
  final_return_block_ = &*(--function_->end());
  context()->AnalyzeDefUse(final_return_block_->GetLabelInst());
  context()->set_instr_block(final_return_block_->GetLabelInst(),
                             final_return_block_);
  assert(final_return_block_->GetParent() == function_ &&
         "The function should have been set when the block was created.");
}